

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::compare(bigint *lhs,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  uVar6 = (lhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar8 = (int)uVar6;
  iVar5 = lhs->exp_ + iVar8;
  uVar9 = (rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar10 = (int)uVar9;
  iVar7 = rhs->exp_ + iVar10;
  if (iVar5 == iVar7) {
    uVar6 = uVar6 & 0xffffffff;
    uVar4 = iVar8 - iVar10;
    uVar9 = uVar9 & 0xffffffff;
    do {
      if ((int)uVar6 <= (int)(~((int)uVar4 >> 0x1f) & uVar4)) {
        if (uVar6 == uVar9) {
          return 0;
        }
        bVar3 = (int)uVar9 < (int)uVar6;
        goto LAB_0011251d;
      }
      if ((int)uVar9 < 1) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                    ,0x146,"negative value");
      }
      uVar2 = (lhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar6 - 1];
      uVar6 = uVar6 - 1;
      uVar1 = (rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar9 - 1];
      iVar8 = ((uVar1 < uVar2) - 1) + (uint)(uVar1 < uVar2);
      uVar9 = uVar9 - 1;
    } while (uVar2 == uVar1);
  }
  else {
    bVar3 = iVar7 < iVar5;
LAB_0011251d:
    iVar8 = (uint)bVar3 * 2 + -1;
  }
  return iVar8;
}

Assistant:

int compare(const bigint& lhs, const bigint& rhs) {
    int num_lhs_bigits = lhs.num_bigits(), num_rhs_bigits = rhs.num_bigits();
    if (num_lhs_bigits != num_rhs_bigits)
      return num_lhs_bigits > num_rhs_bigits ? 1 : -1;
    int i = static_cast<int>(lhs.bigits_.size()) - 1;
    int j = static_cast<int>(rhs.bigits_.size()) - 1;
    int end = i - j;
    if (end < 0) end = 0;
    for (; i >= end; --i, --j) {
      bigit lhs_bigit = lhs[i], rhs_bigit = rhs[j];
      if (lhs_bigit != rhs_bigit) return lhs_bigit > rhs_bigit ? 1 : -1;
    }
    if (i != j) return i > j ? 1 : -1;
    return 0;
  }